

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSP.hpp
# Opt level: O0

void __thiscall Tour::printTour(Tour *this)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  int local_18;
  int local_14;
  int prev_node;
  int next_node;
  Tour *this_local;
  
  _prev_node = this;
  poVar1 = std::operator<<((ostream *)&std::cout,"Forward Traversal");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  pmVar2 = std::
           unordered_map<int,_NodeWrapper,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_NodeWrapper>_>_>
           ::operator[](&this->tour_map_,&this->head_node_);
  local_14 = pmVar2->next_idx_;
  pmVar2 = std::
           unordered_map<int,_NodeWrapper,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_NodeWrapper>_>_>
           ::operator[](&this->tour_map_,&this->head_node_);
  local_18 = pmVar2->prev_idx_;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->head_node_);
  std::operator<<(poVar1,"-->");
  while (local_14 != this->head_node_) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14);
    std::operator<<(poVar1,"-->");
    pmVar2 = std::
             unordered_map<int,_NodeWrapper,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_NodeWrapper>_>_>
             ::operator[](&this->tour_map_,&local_14);
    local_14 = pmVar2->next_idx_;
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->head_node_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Back Traversal");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->head_node_);
  std::operator<<(poVar1,"<--");
  while (local_18 != this->head_node_) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_18);
    std::operator<<(poVar1,"<--");
    pmVar2 = std::
             unordered_map<int,_NodeWrapper,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_NodeWrapper>_>_>
             ::operator[](&this->tour_map_,&local_18);
    local_18 = pmVar2->prev_idx_;
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->head_node_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printTour()
    {
        PRINTN("Forward Traversal")
        int next_node = tour_map_[head_node_].next_idx_;
        int prev_node = tour_map_[head_node_].prev_idx_;
        PRINT(head_node_ << "-->")
        while(next_node != head_node_)
        {
            PRINT(next_node << "-->")
            next_node = tour_map_[next_node].next_idx_;
        }
        PRINTN(head_node_)
        
        PRINTN("Back Traversal")
        PRINT(head_node_ << "<--")
        while(prev_node != head_node_)
        {
            PRINT(prev_node << "<--")
            prev_node = tour_map_[prev_node].prev_idx_;
        }
         PRINTN(head_node_)

    }